

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall VolumeFile::unpackNode(VolumeFile *this,NodeKey *nodeKey,string *filePath)

{
  uint uVar1;
  pointer pSVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> unexpandedData;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pSVar2 = (this->m_dataStreams).
           super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)nodeKey->m_volumeIndex;
  uVar4 = ((long)(this->m_dataStreams).
                 super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x250;
  if (uVar6 < uVar4) {
    uVar1 = nodeKey->m_size2;
    local_68._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    readDataAt(this,&pSVar2[uVar6].stream,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               (ulong)pSVar2[uVar6].sectorSize * (ulong)nodeKey->m_sectorIndex + this->m_dataOffset,
               (ulong)nodeKey->m_size1);
    decryptData(this,local_68._M_impl.super__Vector_impl_data._M_start,
                (long)local_68._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68._M_impl.super__Vector_impl_data._M_start,nodeKey->m_nodeIndex);
    inflateDataIfNeeded(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                        (ulong)uVar1);
    bVar3 = FileExpand::checkIfExpanded
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
    if (bVar3) {
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = FileExpand::unexpand
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
      if (bVar3) {
        saveToFile(filePath,local_48._M_impl.super__Vector_impl_data._M_start,
                   (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error whilst unexpanding file: ");
        poVar5 = std::operator<<(poVar5,(string *)filePath);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    }
    else {
      saveToFile(filePath,local_68._M_impl.super__Vector_impl_data._M_start,
                 (long)local_68._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68._M_impl.super__Vector_impl_data._M_start);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  }
  return uVar6 < uVar4;
}

Assistant:

bool VolumeFile::unpackNode(const NodeKey& nodeKey, const std::string& filePath)
{
	const auto volumeIndex = nodeKey.volumeIndex();
	if (volumeIndex >= m_dataStreams.size()) {
		return false;
	}
	auto& streamDesc = m_dataStreams[volumeIndex];
	
	const auto offset = dataOffset() + static_cast<uint64_t>(nodeKey.sectorIndex()) * streamDesc.sectorSize;
	const auto uncompressedSize = nodeKey.size2();
	
	std::vector<uint8_t> data;
	if (!readDataAt(streamDesc.stream, data, offset, nodeKey.size1())) {
		return false;
	}

	decryptData(data.data(), data.size(), nodeKey.nodeIndex());
	inflateDataIfNeeded(data, uncompressedSize);
	
	if (FileExpand::checkIfExpanded(data)) {
		std::vector<uint8_t> unexpandedData;
		if (FileExpand::unexpand(data, unexpandedData)) {
			saveToFile(filePath, unexpandedData.data(), unexpandedData.size());
		} else {
			std::cerr << "Error whilst unexpanding file: " << filePath << std::endl;
		}
	} else {
		saveToFile(filePath, data.data(), data.size());
	}
	
	return true;
}